

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

ConstPixelBufferAccess *
tcu::getSubregion(ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *access,
                 int x,int y,int width,int height)

{
  IVec3 local_14;
  
  local_14.m_data[2] = 1;
  local_14.m_data[0] = width;
  local_14.m_data[1] = height;
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&access->m_format,&local_14,&access->m_pitch,
             (void *)((long)access->m_data +
                     (long)(y * (access->m_pitch).m_data[1]) +
                     (long)(x * (access->m_pitch).m_data[0])));
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess getSubregion (const ConstPixelBufferAccess& access, int x, int y, int width, int height)
{
	return getSubregion(access, x, y, 0, width, height, 1);
}